

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Parser::ParseIncDec(Parser *this)

{
  bool bVar1;
  bool bVar2;
  RuntimeID RVar3;
  String *pSVar4;
  mapped_type *pmVar5;
  Opcode opcode;
  char (*local_1c8) [10];
  char (*local_180) [10];
  RuntimeID local_168;
  Variant local_160;
  String local_138;
  RuntimeID local_118;
  undefined4 local_10c;
  PropertyName local_108;
  undefined1 local_98 [8];
  String varName;
  PropertyName propName;
  bool increment;
  Parser *this_local;
  
  bVar1 = Accept(this,Increment);
  if (!bVar1) {
    Expect(this,Decrement,(char *)0x0);
  }
  PropertyName::PropertyName((PropertyName *)((long)&varName.field_2 + 8));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_98);
  bVar2 = CheckProperty(this,(size_t *)0x0);
  if (bVar2) {
    ParsePropertyName(&local_108,this);
    PropertyName::operator=((PropertyName *)((long)&varName.field_2 + 8),&local_108);
    PropertyName::~PropertyName(&local_108);
    bVar2 = PropertyName::IsReadOnly((PropertyName *)((long)&varName.field_2 + 8));
    if (bVar2) {
      if (bVar1) {
        local_180 = (char (*) [10])0x162c44;
      }
      else {
        local_180 = (char (*) [10])0x162bf4;
      }
      Error<char_const(&)[10]>(this,"Can\'t %s a readonly property",local_180);
      local_10c = 1;
      goto LAB_00152f8e;
    }
    EmitOpcode(this,PushProp);
    RVar3 = PropertyName::GetId((PropertyName *)((long)&varName.field_2 + 8));
    EmitId(this,RVar3);
    pSVar4 = PropertyName::GetName_abi_cxx11_((PropertyName *)((long)&varName.field_2 + 8));
    local_118 = PropertyName::GetId((PropertyName *)((long)&varName.field_2 + 8));
    pmVar5 = std::
             map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
             ::operator[](&this->m_idNameMap,&local_118);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
              (pmVar5,pSVar4);
  }
  else {
    bVar2 = CheckVariable(this);
    if (!bVar2) {
      if (bVar1) {
        local_1c8 = (char (*) [10])0x162c44;
      }
      else {
        local_1c8 = (char (*) [10])0x162bf4;
      }
      Error<char_const(&)[10]>
                (this,"Valid property or variable name expected after %s keyword",local_1c8);
      local_10c = 1;
      goto LAB_00152f8e;
    }
    ParseVariable_abi_cxx11_(&local_138,this);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_98,
               &local_138);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              (&local_138);
    EmitOpcode(this,PushVar);
    RVar3 = VariableNameToRuntimeID(this,(String *)local_98);
    EmitId(this,RVar3);
  }
  bVar2 = Accept(this,By);
  if (bVar2) {
    ParseExpression(this);
  }
  else {
    EmitOpcode(this,PushVal);
    Variant::Variant(&local_160,1);
    EmitValue(this,&local_160);
    Variant::~Variant(&local_160);
  }
  opcode = Decrement;
  if (bVar1) {
    opcode = Increment;
  }
  EmitOpcode(this,opcode);
  pSVar4 = PropertyName::GetName_abi_cxx11_((PropertyName *)((long)&varName.field_2 + 8));
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::empty
                    (pSVar4);
  if (bVar1) {
    EmitOpcode(this,SetVar);
    RVar3 = VariableNameToRuntimeID(this,(String *)local_98);
    EmitId(this,RVar3);
  }
  else {
    EmitOpcode(this,SetProp);
    RVar3 = PropertyName::GetId((PropertyName *)((long)&varName.field_2 + 8));
    EmitId(this,RVar3);
    pSVar4 = PropertyName::GetName_abi_cxx11_((PropertyName *)((long)&varName.field_2 + 8));
    local_168 = PropertyName::GetId((PropertyName *)((long)&varName.field_2 + 8));
    pmVar5 = std::
             map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
             ::operator[](&this->m_idNameMap,&local_168);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
              (pmVar5,pSVar4);
  }
  Expect(this,NewLine,(char *)0x0);
  local_10c = 0;
LAB_00152f8e:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_98);
  PropertyName::~PropertyName((PropertyName *)((long)&varName.field_2 + 8));
  return;
}

Assistant:

inline_t void Parser::ParseIncDec()
	{
		bool increment = Accept(SymbolType::Increment);
		if (!increment)
			Expect(SymbolType::Decrement);
		PropertyName propName;
		String varName;
		if (CheckProperty())
		{
			propName = ParsePropertyName();
			if (propName.IsReadOnly())
			{
				Error("Can't %s a readonly property", increment ? "increment" : "decrement");
				return;
			}
			EmitOpcode(Opcode::PushProp);
			EmitId(propName.GetId());
			m_idNameMap[propName.GetId()] = propName.GetName();
		}
		else if (CheckVariable())
		{
			varName = ParseVariable();
			EmitOpcode(Opcode::PushVar);
			EmitId(VariableNameToRuntimeID(varName));
		}
		else
		{
			Error("Valid property or variable name expected after %s keyword", increment ? "increment" : "decrement");
			return;
		}
		if (Accept(SymbolType::By))
		{
			ParseExpression();
		}
		else
		{
			EmitOpcode(Opcode::PushVal);
			EmitValue(1);
		}
		EmitOpcode(increment ? Opcode::Increment : Opcode::Decrement);
		if (!propName.GetName().empty())
		{
			EmitOpcode(Opcode::SetProp);
			EmitId(propName.GetId());
			m_idNameMap[propName.GetId()] = propName.GetName();
		}
		else
		{
			EmitOpcode(Opcode::SetVar);
			EmitId(VariableNameToRuntimeID(varName));
		}
		Expect(SymbolType::NewLine);
	}